

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void startElementDebug(void *ctx,xmlChar *name,xmlChar **atts)

{
  int local_2c;
  int i;
  xmllintState *lint;
  xmlChar **atts_local;
  xmlChar *name_local;
  void *ctx_local;
  
  *(int *)((long)ctx + 0x24) = *(int *)((long)ctx + 0x24) + 1;
  if (*(int *)((long)ctx + 0x34) == 0) {
    fprintf(_stdout,"SAX.startElement(%s",name);
    if (atts != (xmlChar **)0x0) {
      for (local_2c = 0; atts[local_2c] != (xmlChar *)0x0; local_2c = local_2c + 2) {
        fprintf(_stdout,", %s=\'",atts[local_2c]);
        if (atts[local_2c + 1] != (xmlChar *)0x0) {
          fprintf(_stdout,"%s\'",atts[local_2c + 1]);
        }
      }
    }
    fprintf(_stdout,")\n");
  }
  return;
}

Assistant:

static void
startElementDebug(void *ctx, const xmlChar *name, const xmlChar **atts)
{
    xmllintState *lint = ctx;
    int i;

    lint->callbacks++;
    if (lint->noout)
	return;
    fprintf(stdout, "SAX.startElement(%s", (char *) name);
    if (atts != NULL) {
        for (i = 0;(atts[i] != NULL);i++) {
	    fprintf(stdout, ", %s='", atts[i++]);
	    if (atts[i] != NULL)
	        fprintf(stdout, "%s'", atts[i]);
	}
    }
    fprintf(stdout, ")\n");
}